

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::set_ssl_cert
          (torrent *this,string *certificate,string *private_key,string *dh_params,
          string *passphrase)

{
  int *piVar1;
  context *pcVar2;
  pointer pcVar3;
  peer_connection **pppVar4;
  int iVar5;
  undefined8 *u;
  long *plVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  BIO *bp;
  long lVar7;
  ulong uVar8;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  uint uVar9;
  DH *pDVar10;
  string *psVar11;
  char cVar12;
  error_code local_a0;
  undefined1 local_90 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  string *local_68;
  bio_cleanup local_60;
  string *local_58;
  peer_connection **local_50;
  pointer local_48;
  peer_connection *local_40 [2];
  
  pcVar2 = (this->m_ssl_ctx)._M_t.
           super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
           ._M_t.
           super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
           .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  local_68 = dh_params;
  local_58 = certificate;
  if (pcVar2 == (context *)0x0) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar5) + 0x68) & 0x41) == 0) {
      return;
    }
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_90);
    local_a0.val_ = 0x71;
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum,char_const(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_02,iVar5),(torrent_handle *)local_90,
               (error_code_enum *)&local_a0,(char (*) [1])0x3de9eb);
    if ((piece_picker *)local_90._8_8_ == (piece_picker *)0x0) {
      return;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)(local_90._8_8_ + 0xc);
      iVar5 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = *(int *)(local_90._8_8_ + 0xc);
      *(int *)(local_90._8_8_ + 0xc) = iVar5 + -1;
    }
    if (iVar5 != 1) {
      return;
    }
    (**(code **)(*(long *)local_90._8_8_ + 0x18))();
    return;
  }
  local_a0.val_ = 0;
  local_a0.failed_ = false;
  local_70._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &boost::system::detail::cat_holder<void>::system_category_instance;
  local_a0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_50 = local_40;
  pcVar3 = (passphrase->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + passphrase->_M_string_length);
  pppVar4 = local_50;
  u = (undefined8 *)operator_new(0x28);
  local_90._0_8_ = local_90 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pppVar4,(long)(local_48 + 10) + (long)(pppVar4 + -10));
  *u = &PTR__password_callback_004e7610;
  u[1] = u + 3;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(u + 1),local_90._0_8_,
             (long)&(((vector<piece_pos,_piece_index_t> *)local_90._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_90._0_8_);
  plVar6 = (long *)SSL_CTX_get_default_passwd_cb_userdata(pcVar2->handle_);
  SSL_CTX_set_default_passwd_cb_userdata((SSL_CTX *)pcVar2->handle_,u);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))(plVar6);
  }
  SSL_CTX_set_default_passwd_cb
            ((SSL_CTX *)pcVar2->handle_,boost::asio::ssl::context::password_callback_function);
  local_a0.val_ = 0;
  local_a0.failed_ = false;
  local_a0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  if ((DH *)local_90._0_8_ != (DH *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(ulong)((long)&(local_40[0]->super_bandwidth_socket).
                                            _vptr_bandwidth_socket + 1));
  }
  psVar11 = local_58;
  if ((local_a0.failed_ == true) &&
     (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])(),
     (*(uint *)(CONCAT44(extraout_var,iVar5) + 0x68) & 0x41) != 0)) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_90);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar5),(torrent_handle *)local_90,&local_a0
               ,(char (*) [1])0x3de9eb);
    if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         )local_90._8_8_ != (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(local_90._8_8_ + 0xc);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)(local_90._8_8_ + 0xc);
        *(int *)(local_90._8_8_ + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*(long *)local_90._8_8_ + 0x18))();
      }
    }
  }
  pcVar2 = (this->m_ssl_ctx)._M_t.
           super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
           ._M_t.
           super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
           .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  ERR_clear_error();
  iVar5 = SSL_CTX_use_certificate_file((SSL_CTX *)pcVar2->handle_,(psVar11->_M_dataplus)._M_p,1);
  if (iVar5 == 1) {
    local_a0.val_ = 0;
    local_a0.failed_ = false;
    local_a0.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  }
  else {
    uVar8 = ERR_get_error();
    uVar9 = (uint)uVar8;
    if ((DAT_004ecf68 == -0x4d54ee85da8120f3) || (DAT_004ecf68 == -0x70502de1da3a1f65)) {
      local_a0.failed_ = uVar9 != 0;
    }
    else {
      local_a0.failed_ =
           (bool)(**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                           (&boost::asio::error::get_ssl_category()::instance,uVar8 & 0xffffffff);
    }
    local_a0.cat_ = (error_category *)&boost::asio::error::get_ssl_category()::instance;
    local_a0.val_ = uVar9;
    if ((local_a0.failed_ != false) &&
       (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])(),
       (*(uint *)(CONCAT44(extraout_var_03,iVar5) + 0x68) & 0x41) != 0)) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_90);
      alert_manager::
      emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                ((alert_manager *)CONCAT44(extraout_var_04,iVar5),(torrent_handle *)local_90,
                 &local_a0,psVar11);
      if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_90._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)(local_90._8_8_ + 0xc);
          iVar5 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = *(int *)(local_90._8_8_ + 0xc);
          *(int *)(local_90._8_8_ + 0xc) = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (**(code **)(*(long *)local_90._8_8_ + 0x18))();
        }
      }
    }
  }
  pDVar10 = (DH *)(local_90 + 0x10);
  iVar5 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar5 != '\0') {
    (*((error_category *)&(local_a0.cat_)->_vptr_error_category)->_vptr_error_category[4])
              (local_90,local_a0.cat_,(ulong)(uint)local_a0.val_);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** use certificate file: %s",local_90._0_8_);
    if ((DH *)local_90._0_8_ != pDVar10) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
    }
  }
  pcVar2 = (this->m_ssl_ctx)._M_t.
           super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
           ._M_t.
           super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
           .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  ERR_clear_error();
  iVar5 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)pcVar2->handle_,(private_key->_M_dataplus)._M_p,1);
  if (iVar5 == 1) {
    local_a0.val_ = 0;
    local_a0.failed_ = false;
    local_a0.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    psVar11 = local_68;
  }
  else {
    uVar8 = ERR_get_error();
    uVar9 = (uint)uVar8;
    if ((DAT_004ecf68 == -0x4d54ee85da8120f3) || (DAT_004ecf68 == -0x70502de1da3a1f65)) {
      local_a0.failed_ = uVar9 != 0;
    }
    else {
      local_a0.failed_ =
           (bool)(**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                           (&boost::asio::error::get_ssl_category()::instance,uVar8 & 0xffffffff);
    }
    psVar11 = local_68;
    local_a0.cat_ = (error_category *)&boost::asio::error::get_ssl_category()::instance;
    local_a0.val_ = uVar9;
    if ((local_a0.failed_ != false) &&
       (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])(),
       (*(uint *)(CONCAT44(extraout_var_05,iVar5) + 0x68) & 0x41) != 0)) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_90);
      alert_manager::
      emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                ((alert_manager *)CONCAT44(extraout_var_06,iVar5),(torrent_handle *)local_90,
                 &local_a0,private_key);
      if ((piece_picker *)local_90._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)(local_90._8_8_ + 0xc);
          iVar5 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = *(int *)(local_90._8_8_ + 0xc);
          *(int *)(local_90._8_8_ + 0xc) = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (**(code **)(*(long *)local_90._8_8_ + 0x18))();
        }
      }
    }
  }
  iVar5 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar5 != '\0') {
    (*((error_category *)&(local_a0.cat_)->_vptr_error_category)->_vptr_error_category[4])
              (local_90,local_a0.cat_,(ulong)(uint)local_a0.val_);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** use private key file: %s",local_90._0_8_);
    if ((DH *)local_90._0_8_ != pDVar10) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
    }
  }
  pcVar2 = (this->m_ssl_ctx)._M_t.
           super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
           ._M_t.
           super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
           .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  ERR_clear_error();
  bp = BIO_new_file((psVar11->_M_dataplus)._M_p,"r");
  local_60.p = (BIO *)bp;
  if (bp == (BIO *)0x0) {
    uVar8 = ERR_get_error();
    if ((DAT_004ecf68 == -0x4d54ee85da8120f3) || (DAT_004ecf68 == -0x70502de1da3a1f65)) {
      local_a0.failed_ = (int)uVar8 != 0;
    }
    else {
      local_a0.failed_ =
           (bool)(**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                           (&boost::asio::error::get_ssl_category()::instance,uVar8 & 0xffffffff);
    }
    local_a0.cat_ = (error_category *)&boost::asio::error::get_ssl_category()::instance;
    local_a0.val_ = (int)uVar8;
    goto LAB_0031f618;
  }
  ERR_clear_error();
  local_90._0_8_ = PEM_read_bio_DHparams(bp,(DH **)0x0,(undefined1 *)0x0,(void *)0x0);
  if ((DH *)local_90._0_8_ == (DH *)0x0) {
LAB_0031f558:
    uVar8 = ERR_get_error();
    local_70._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &boost::asio::error::get_ssl_category()::instance;
    iVar5 = (int)uVar8;
    if ((DAT_004ecf68 == -0x4d54ee85da8120f3) || (DAT_004ecf68 == -0x70502de1da3a1f65)) {
      cVar12 = iVar5 != 0;
    }
    else {
      cVar12 = (**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                         (&boost::asio::error::get_ssl_category()::instance,uVar8 & 0xffffffff);
    }
  }
  else {
    iVar5 = 0;
    lVar7 = SSL_CTX_ctrl((SSL_CTX *)pcVar2->handle_,3,0,(void *)local_90._0_8_);
    cVar12 = '\0';
    if (lVar7 != 1) goto LAB_0031f558;
  }
  local_a0.cat_ = (error_category *)local_70._M_pi;
  local_a0.val_ = iVar5;
  local_a0.failed_ = (bool)cVar12;
  boost::asio::ssl::context::dh_cleanup::~dh_cleanup((dh_cleanup *)local_90);
LAB_0031f618:
  boost::asio::ssl::context::bio_cleanup::~bio_cleanup(&local_60);
  if ((local_a0.failed_ == true) &&
     (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])(),
     (*(uint *)(CONCAT44(extraout_var_07,iVar5) + 0x68) & 0x41) != 0)) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_90);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_08,iVar5),(torrent_handle *)local_90,&local_a0
               ,psVar11);
    if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         )local_90._8_8_ != (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(local_90._8_8_ + 0xc);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)(local_90._8_8_ + 0xc);
        *(int *)(local_90._8_8_ + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*(long *)local_90._8_8_ + 0x18))();
      }
    }
  }
  iVar5 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar5 != '\0') {
    (**(code **)((long)((error_category *)&(local_a0.cat_)->_vptr_error_category)->
                       _vptr_error_category + 0x20))(local_90,local_a0.cat_,local_a0.val_);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** use DH file: %s",local_90._0_8_);
    if ((DH *)local_90._0_8_ != pDVar10) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
    }
  }
  return;
}

Assistant:

void torrent::set_ssl_cert(std::string const& certificate
		, std::string const& private_key
		, std::string const& dh_params
		, std::string const& passphrase)
	{
		if (!m_ssl_ctx)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle()
					, errors::not_an_ssl_torrent, "");
			return;
		}

		error_code ec;
		m_ssl_ctx->set_password_callback(
				[passphrase](std::size_t, ssl::context::password_purpose purpose)
				{
					return purpose == ssl::context::for_reading ? passphrase : "";
				}
				, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "");
		}
		m_ssl_ctx->use_certificate_file(certificate, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, certificate);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use certificate file: %s", ec.message().c_str());
#endif
		m_ssl_ctx->use_private_key_file(private_key, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, private_key);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use private key file: %s", ec.message().c_str());
#endif
		m_ssl_ctx->use_tmp_dh_file(dh_params, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, dh_params);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use DH file: %s", ec.message().c_str());
#endif
	}